

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *expected_expression,char *actual_expression,BiggestInt expected,
          BiggestInt actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar1;
  BiggestInt local_68;
  BiggestInt local_60;
  string local_58;
  string local_38;
  
  if (expected == actual) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_68 = actual;
    local_60 = expected;
    PrintToString<long_long>(&local_38,&local_60);
    PrintToString<long_long>(&local_58,&local_68);
    AVar1 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_58,false);
    actual_expression = (char *)AVar1.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      actual_expression = (char *)extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      actual_expression = (char *)extraout_RDX_00;
    }
  }
  AVar1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_expression;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}